

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tck-reach.cc
# Opt level: O2

int parse_command_line(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  runtime_error *prVar3;
  allocator<char> local_75;
  int long_option_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  while( true ) {
    while( true ) {
      while( true ) {
        long_option_index = -1;
        iVar2 = getopt_long(argc,argv,"a:C:hl:o:s:",long_options,&long_option_index);
        pcVar1 = _optarg;
        if (iVar2 == 0) break;
        if (iVar2 == 0x43) {
          iVar2 = strcmp(_optarg,"none");
          if (iVar2 == 0) {
            certificate = CERTIFICATE_NONE;
          }
          else {
            iVar2 = strcmp(pcVar1,"graph");
            if (iVar2 == 0) {
              certificate = CERTIFICATE_GRAPH;
            }
            else {
              iVar2 = strcmp(pcVar1,"concrete");
              if (iVar2 == 0) {
                certificate = CERTIFICATE_CONCRETE;
              }
              else {
                iVar2 = strcmp(pcVar1,"symbolic");
                if (iVar2 != 0) {
                  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_70,_optarg,&local_75);
                  std::operator+(&local_50,"Unknown type of certificate: ",&local_70);
                  std::runtime_error::runtime_error(prVar3,(string *)&local_50);
                  __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                certificate = CERTIFICATE_SYMBOLIC;
              }
            }
          }
        }
        else if (iVar2 == 0x61) {
          iVar2 = strcmp(_optarg,"reach");
          if (iVar2 == 0) {
            algorithm = ALGO_REACH;
          }
          else {
            iVar2 = strcmp(pcVar1,"concur19");
            if (iVar2 == 0) {
              algorithm = ALGO_CONCUR19;
            }
            else {
              iVar2 = strcmp(pcVar1,"covreach");
              if (iVar2 != 0) {
                prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_70,_optarg,&local_75);
                std::operator+(&local_50,"Unknown algorithm: ",&local_70);
                std::runtime_error::runtime_error(prVar3,(string *)&local_50);
                __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              algorithm = ALGO_COVREACH;
            }
          }
        }
        else if (iVar2 == 0x68) {
          help = 1;
        }
        else if (iVar2 == 0x6c) {
          std::__cxx11::string::assign((char *)&labels_abi_cxx11_);
        }
        else if (iVar2 == 0x6f) {
          std::__cxx11::string::assign((char *)&output_file_abi_cxx11_);
        }
        else {
          if (iVar2 != 0x73) {
            if (iVar2 == -1) {
              return _optind;
            }
            if (iVar2 == 0x3f) {
              prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar3,"Unknown command-line option");
            }
            else if (iVar2 == 0x3a) {
              prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar3,"Missing option parameter");
            }
            else {
              prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar3,"This should never be executed");
            }
            goto LAB_0012a933;
          }
          std::__cxx11::string::assign((char *)&search_order_abi_cxx11_);
        }
      }
      pcVar1 = long_options[long_option_index].name;
      iVar2 = strcmp(pcVar1,"block-size");
      if (iVar2 != 0) break;
      block_size = strtoull(_optarg,(char **)0x0,10);
    }
    iVar2 = strcmp(pcVar1,"table-size");
    if (iVar2 != 0) break;
    table_size = strtoull(_optarg,(char **)0x0,10);
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"This also should never be executed");
LAB_0012a933:
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int parse_command_line(int argc, char * argv[])
{
  while (true) {
    int long_option_index = -1;
    int c = getopt_long(argc, argv, options, long_options, &long_option_index);

    if (c == -1)
      break;

    if (c == ':')
      throw std::runtime_error("Missing option parameter");
    else if (c == '?')
      throw std::runtime_error("Unknown command-line option");
    else if (c != 0) {
      switch (c) {
      case 'a':
        if (strcmp(optarg, "reach") == 0)
          algorithm = ALGO_REACH;
        else if (strcmp(optarg, "concur19") == 0)
          algorithm = ALGO_CONCUR19;
        else if (strcmp(optarg, "covreach") == 0)
          algorithm = ALGO_COVREACH;
        else
          throw std::runtime_error("Unknown algorithm: " + std::string(optarg));
        break;
      case 'C':
        if (strcmp(optarg, "none") == 0)
          certificate = CERTIFICATE_NONE;
        else if (strcmp(optarg, "graph") == 0)
          certificate = CERTIFICATE_GRAPH;
        else if (strcmp(optarg, "concrete") == 0)
          certificate = CERTIFICATE_CONCRETE;
        else if (strcmp(optarg, "symbolic") == 0)
          certificate = CERTIFICATE_SYMBOLIC;
        else
          throw std::runtime_error("Unknown type of certificate: " + std::string(optarg));
        break;
      case 'o':
        output_file = optarg;
        break;
      case 'h':
        help = true;
        break;
      case 'l':
        labels = optarg;
        break;
      case 's':
        search_order = optarg;
        break;
      default:
        throw std::runtime_error("This should never be executed");
        break;
      }
    }
    else {
      if (strcmp(long_options[long_option_index].name, "block-size") == 0)
        block_size = std::strtoull(optarg, nullptr, 10);
      else if (strcmp(long_options[long_option_index].name, "table-size") == 0)
        table_size = std::strtoull(optarg, nullptr, 10);
      else
        throw std::runtime_error("This also should never be executed");
    }
  }

  return optind;
}